

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O1

void __thiscall
VariationalBayesEstimatorOnLDA::updateHyperParameters(VariationalBayesEstimatorOnLDA *this)

{
  longdouble lVar1;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *in_RCX;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *pol;
  integral_constant<int,_53> *in_RDX;
  integral_constant<int,_53> *extraout_RDX;
  integral_constant<int,_53> *extraout_RDX_00;
  integral_constant<int,_53> *extraout_RDX_01;
  integral_constant<int,_53> *extraout_RDX_02;
  integral_constant<int,_53> *extraout_RDX_03;
  integral_constant<int,_53> *extraout_RDX_04;
  integral_constant<int,_53> *piVar2;
  integral_constant<int,_53> *extraout_RDX_05;
  integral_constant<int,_53> *extraout_RDX_06;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  longdouble in_ST0;
  longdouble lVar6;
  longdouble in_ST1;
  longdouble lVar7;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar8;
  longdouble in_ST5;
  longdouble lVar9;
  longdouble in_ST6;
  double dVar10;
  detail local_d5;
  longdouble local_d4;
  detail local_c9;
  longdouble local_c8;
  longdouble local_b8;
  double local_a8;
  longdouble local_a0;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  longdouble local_3c;
  
  if (this->_D == 0) {
    local_a8 = 0.0;
  }
  else {
    local_a8 = 0.0;
    uVar3 = 0;
    local_d4 = (longdouble)1.79769313486232e+308;
    do {
      local_48 = (this->_nd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar3] + this->_alphaSum;
      boost::math::detail::
      digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                ((longdouble *)0x0,&local_d5,(longdouble)local_48,in_RDX,in_RCX);
      lVar6 = ABS(in_ST0);
      dVar10 = 0.0;
      piVar2 = extraout_RDX;
      if (local_d4 < lVar6) {
        local_c8 = lVar6;
        local_b8 = in_ST0;
        boost::math::policies::detail::raise_error<std::overflow_error,double>
                  ("boost::math::digamma<%1%>(%1%)","numeric overflow");
        dVar10 = (double)local_b8;
        piVar2 = extraout_RDX_00;
        lVar6 = local_c8;
        in_ST0 = local_b8;
        local_50 = dVar10;
      }
      local_58 = (double)in_ST0;
      if (lVar6 <= local_d4) {
        dVar10 = local_58;
      }
      local_b8 = (longdouble)CONCAT28(local_b8._8_2_,dVar10);
      lVar8 = in_ST5;
      boost::math::detail::
      digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                ((longdouble *)0x0,&local_d5,(longdouble)this->_alphaSum,piVar2,in_RCX);
      lVar6 = ABS(in_ST1);
      dVar10 = 0.0;
      in_RDX = extraout_RDX_01;
      lVar7 = in_ST1;
      in_ST0 = in_ST2;
      lVar1 = in_ST3;
      lVar9 = in_ST4;
      if (local_d4 < lVar6) {
        local_c8 = in_ST1;
        local_a0 = lVar6;
        boost::math::policies::detail::raise_error<std::overflow_error,double>
                  ("boost::math::digamma<%1%>(%1%)","numeric overflow");
        dVar10 = (double)local_c8;
        in_RDX = extraout_RDX_02;
        lVar6 = local_a0;
        lVar7 = local_c8;
        in_ST0 = in_ST2;
        lVar1 = in_ST3;
        lVar9 = in_ST4;
        local_60 = dVar10;
      }
      in_ST4 = lVar8;
      in_ST3 = in_ST5;
      in_ST2 = lVar9;
      in_ST1 = lVar1;
      local_68 = (double)lVar7;
      if (lVar6 <= local_d4) {
        dVar10 = local_68;
      }
      local_a8 = local_a8 + (local_b8._0_8_ - dVar10);
      uVar3 = uVar3 + 1;
      in_ST5 = in_ST4;
      in_ST6 = in_ST4;
    } while (uVar3 < this->_D);
  }
  if (this->_K != 0) {
    uVar3 = 0;
    local_b8 = (longdouble)1.79769313486232e+308;
    do {
      dVar10 = 0.0;
      if (this->_D != 0) {
        lVar4 = 0;
        uVar5 = 0;
        do {
          local_c8 = (longdouble)CONCAT28(local_c8._8_2_,dVar10);
          pol = *(policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                  **)((long)&(((this->_ndk).
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar4);
          local_70 = *(double *)(pol + uVar3 * 8) +
                     (this->_alpha).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar3];
          boost::math::detail::
          digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                    ((longdouble *)0x0,&local_c9,(longdouble)local_70,in_RDX,pol);
          lVar6 = ABS(in_ST0);
          dVar10 = 0.0;
          piVar2 = extraout_RDX_03;
          lVar7 = in_ST2;
          lVar1 = in_ST4;
          local_d4 = in_ST0;
          if (local_b8 < lVar6) {
            local_a0 = lVar6;
            boost::math::policies::detail::raise_error<std::overflow_error,double>
                      ("boost::math::digamma<%1%>(%1%)","numeric overflow");
            dVar10 = (double)local_d4;
            piVar2 = extraout_RDX_04;
            lVar6 = local_a0;
            lVar7 = in_ST2;
            lVar1 = in_ST4;
            local_78 = dVar10;
          }
          in_ST4 = in_ST6;
          in_ST2 = lVar1;
          in_ST0 = lVar7;
          local_80 = (double)local_d4;
          if (lVar6 <= local_b8) {
            dVar10 = local_80;
          }
          local_a0 = (longdouble)CONCAT28(local_a0._8_2_,dVar10);
          lVar9 = in_ST4;
          boost::math::detail::
          digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                    ((longdouble *)0x0,&local_d5,
                     (longdouble)
                     (this->_alpha).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar3],piVar2,pol);
          lVar6 = ABS(in_ST1);
          dVar10 = 0.0;
          in_RDX = extraout_RDX_05;
          lVar7 = in_ST3;
          lVar1 = in_ST5;
          local_d4 = in_ST1;
          if (local_b8 < lVar6) {
            local_3c = lVar6;
            boost::math::policies::detail::raise_error<std::overflow_error,double>
                      ("boost::math::digamma<%1%>(%1%)","numeric overflow");
            dVar10 = (double)local_d4;
            in_RDX = extraout_RDX_06;
            lVar6 = local_3c;
            lVar7 = in_ST3;
            lVar1 = in_ST5;
            local_88 = dVar10;
          }
          in_ST5 = lVar9;
          in_ST3 = lVar1;
          in_ST1 = lVar7;
          local_90 = (double)local_d4;
          if (lVar6 <= local_b8) {
            dVar10 = local_90;
          }
          dVar10 = local_c8._0_8_ +
                   (local_a0._0_8_ - dVar10) *
                   (this->_alpha).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar3];
          uVar5 = uVar5 + 1;
          lVar4 = lVar4 + 0x18;
          in_ST6 = in_ST5;
        } while (uVar5 < this->_D);
      }
      (this->_alpha).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] = dVar10 / local_a8;
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->_K);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->_alphaTimeSeries,&this->_alpha);
  (*this->_vptr_VariationalBayesEstimatorOnLDA[8])(this,0);
  (*this->_vptr_VariationalBayesEstimatorOnLDA[5])(this);
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::updateHyperParameters(){//{{{
    double denominator = 0;
    for(int d=0;d<_D;d++){
        denominator += boost::math::digamma(_nd[d]+_alphaSum) - boost::math::digamma(_alphaSum);
    }
    for(int k=0;k<_K;k++){
        double numerator = 0;
        for(int d=0;d<_D;d++){
            //ndk == 0 -> alphak == 0  digamma(0) - digamma(0) = 0
            try{
                numerator += (boost::math::digamma(_ndk[d][k]+_alpha[k]) - boost::math::digamma(_alpha[k])) * _alpha[k];
            }catch(...){
                numerator += 0;
            }
        }
        _alpha[k] = numerator / denominator;
    }
    _alphaTimeSeries.push_back(_alpha);
    this->updateBeta(SYMMETRY);
    this->calculateHyperParamSum();
}